

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFile.c
# Opt level: O0

deFile * deFile_create(char *filename,deUint32 mode)

{
  int iVar1;
  int fd;
  deUint32 mode_local;
  char *filename_local;
  
  iVar1 = mapOpenMode(mode);
  iVar1 = open(filename,iVar1,0x1ff);
  if (iVar1 < 0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)deFile_createFromHandle((long)iVar1);
  }
  return (deFile *)filename_local;
}

Assistant:

deFile* deFile_create (const char* filename, deUint32 mode)
{
	int fd = open(filename, mapOpenMode(mode), 0777);
	if (fd >= 0)
		return deFile_createFromHandle((deUintptr)fd);
	else
		return DE_NULL;
}